

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O2

Binding __thiscall
Lib::
BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
::pop(BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
      *this)

{
  Binding *pBVar1;
  uint uVar2;
  Binding *pBVar3;
  TermList TVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined4 uVar7;
  uint uVar8;
  undefined4 uVar9;
  uint uVar10;
  Binding BVar11;
  
  pBVar3 = this->_data;
  uVar2 = pBVar3->var;
  TVar4._content = (pBVar3->term)._content;
  uVar10 = this->_size - 1;
  this->_size = uVar10;
  if (uVar10 != 0) {
    uVar8 = pBVar3->var;
    uVar9 = *(undefined4 *)&pBVar3->field_0x4;
    uVar5 = (pBVar3->term)._content;
    pBVar1 = pBVar3 + uVar10;
    uVar7 = *(undefined4 *)&pBVar1->field_0x4;
    uVar6 = (pBVar1->term)._content;
    pBVar3->var = pBVar1->var;
    *(undefined4 *)&pBVar3->field_0x4 = uVar7;
    (pBVar3->term)._content = uVar6;
    pBVar3 = pBVar3 + uVar10;
    pBVar3->var = uVar8;
    *(undefined4 *)&pBVar3->field_0x4 = uVar9;
    (pBVar3->term)._content = uVar5;
    bubbleDown(this,1);
  }
  BVar11._4_4_ = 0;
  BVar11.var = uVar2;
  BVar11.term._content = TVar4._content;
  return BVar11;
}

Assistant:

inline
  T pop()
  {
    ASS(!isEmpty());
    T res=_data[0];
    _size--;
    if(_size) {
      std::swap(_data[0],_data[_size]);
      bubbleDown(1);
    }
    _data[_size].~T();
    return res;
  }